

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O0

bool __thiscall re2::Prog::IsOnePass(Prog *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint32 uVar3;
  bool bVar4;
  int iVar5;
  int statesize_00;
  int iVar6;
  int iVar7;
  int iVar8;
  InstOp IVar9;
  uint uVar10;
  EmptyOp EVar11;
  ulong uVar12;
  int *piVar13;
  void *__s;
  uint8 *nodes_00;
  iterator piVar14;
  ostream *poVar15;
  int *piVar16;
  uint8 *nodes_01;
  OneState *pOVar17;
  EmptyOp local_284;
  uint32 newact_1;
  uint32 act_1;
  int b_2;
  int c_1;
  int local_26c;
  int local_268;
  Rune hi;
  uint32 local_260;
  EmptyOp local_25c;
  Rune lo;
  uint32 newact;
  uint32 act;
  int b_1;
  int c;
  int nextindex;
  Inst *local_c8;
  Inst *ip;
  int local_b8;
  uint32 cond;
  int id_1;
  int nstack;
  bool matched;
  OneState *pOStack_a8;
  int b;
  OneState *node;
  int nodeindex;
  int id;
  iterator it;
  int nalloc;
  undefined1 local_80 [8];
  Instq workq;
  Instq tovisit;
  uint8 *nodep;
  uint8 *nodes;
  int *nodebyid;
  int size;
  InstCond *stack;
  int stacksize;
  int statesize;
  int maxnodes;
  Prog *this_local;
  
  if ((this->did_onepass_ & 1U) == 0) {
    this->did_onepass_ = true;
    iVar5 = start(this);
    if (iVar5 == 0) {
      this_local._7_1_ = false;
    }
    else {
      iVar5 = inst_count(this,kInstByteRange);
      iVar5 = iVar5 + 2;
      statesize_00 = this->bytemap_range_ * 4 + 4;
      if ((iVar5 < 65000) && ((long)iVar5 <= (this->dfa_mem_ / 4) / (long)statesize_00)) {
        iVar6 = inst_count(this,kInstCapture);
        iVar7 = inst_count(this,kInstEmptyWidth);
        iVar8 = inst_count(this,kInstNop);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)(iVar8 + 1 + iVar6 + iVar7);
        uVar12 = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          uVar12 = 0xffffffffffffffff;
        }
        piVar13 = (int *)operator_new__(uVar12);
        iVar6 = Prog::size(this);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (long)iVar6;
        uVar12 = SUB168(auVar2 * ZEXT816(4),0);
        if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
          uVar12 = 0xffffffffffffffff;
        }
        __s = operator_new__(uVar12);
        memset(__s,0xff,(long)iVar6 << 2);
        uVar12 = (long)(iVar5 * statesize_00);
        if ((long)(iVar5 * statesize_00) < 0) {
          uVar12 = 0xffffffffffffffff;
        }
        nodes_00 = (uint8 *)operator_new__(uVar12);
        SparseSet::SparseSet((SparseSet *)&workq.dense_,iVar6);
        SparseSet::SparseSet((SparseSet *)local_80,iVar6);
        iVar6 = start(this);
        AddQ((Instq *)&workq.dense_,iVar6);
        iVar6 = start(this);
        *(undefined4 *)((long)__s + (long)iVar6 * 4) = 0;
        it._0_4_ = 1;
        for (_nodeindex = SparseSet::begin((SparseSet *)&workq.dense_); piVar16 = _nodeindex,
            piVar14 = SparseSet::end((SparseSet *)&workq.dense_), piVar16 != piVar14;
            _nodeindex = _nodeindex + 1) {
          node._4_4_ = *_nodeindex;
          node._0_4_ = *(int *)((long)__s + (long)node._4_4_ * 4);
          pOStack_a8 = IndexToNode(nodes_00,statesize_00,(int)node);
          for (nstack = 0; nstack < this->bytemap_range_; nstack = nstack + 1) {
            pOStack_a8[(long)nstack + 1].matchcond = 0x30;
          }
          pOStack_a8->matchcond = 0x30;
          SparseSet::clear((SparseSet *)local_80);
          id_1._3_1_ = 0;
          *piVar13 = node._4_4_;
          cond = 1;
          piVar13[1] = 0;
LAB_0018d047:
          if (0 < (int)cond) {
            cond = cond - 1;
            local_b8 = piVar13[(long)(int)cond * 2];
            ip._4_4_ = piVar13[(long)(int)cond * 2 + 1];
LAB_0018d088:
            local_c8 = inst(this,local_b8);
            IVar9 = Inst::opcode(local_c8);
            switch(IVar9) {
            case kInstAltMatch:
              iVar6 = Inst::last(local_c8);
              if (iVar6 != 0) {
                __assert_fail("!ip->last()",
                              "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/onepass.cc"
                              ,0x1ba,"bool re2::Prog::IsOnePass()");
              }
              bVar4 = AddQ((Instq *)local_80,local_b8 + 1);
              if (bVar4) {
                local_b8 = local_b8 + 1;
                goto LAB_0018d088;
              }
              break;
            case kInstByteRange:
              iVar7 = Inst::out(local_c8);
              iVar6 = (int)it;
              b_1 = *(int *)((long)__s + (long)iVar7 * 4);
              if (b_1 == -1) {
                if (iVar5 <= (int)it) break;
                b_1 = (int)it;
                iVar7 = Inst::out(local_c8);
                *(int *)((long)__s + (long)iVar7 * 4) = iVar6;
                it._0_4_ = (int)it + 1;
                iVar6 = Inst::out(local_c8);
                AddQ((Instq *)&workq.dense_,iVar6);
              }
              for (act = Inst::lo(local_c8); uVar3 = act, iVar6 = Inst::hi(local_c8),
                  (int)uVar3 <= iVar6; act = act + 1) {
                newact = (uint32)this->bytemap_[(int)act];
                while( true ) {
                  bVar4 = false;
                  if ((int)act < 0xff) {
                    bVar4 = this->bytemap_[(int)(act + 1)] == newact;
                  }
                  if (!bVar4) break;
                  act = act + 1;
                }
                lo = pOStack_a8[(long)(int)newact + 1].matchcond;
                local_25c = b_1 << 0x10 | ip._4_4_;
                if ((id_1._3_1_ & 1) != 0) {
                  local_25c = local_25c | 0x40;
                }
                if ((lo & (kEmptyNonWordBoundary|kEmptyWordBoundary)) ==
                    (kEmptyNonWordBoundary|kEmptyWordBoundary)) {
                  pOStack_a8[(long)(int)newact + 1].matchcond = local_25c;
                }
                else if (lo != local_25c) goto LAB_0018da6a;
              }
              iVar6 = Inst::foldcase(local_c8);
              if (iVar6 != 0) {
                hi = Inst::lo(local_c8);
                local_268 = 0x61;
                piVar16 = std::max<int>(&hi,&local_268);
                local_260 = *piVar16 - 0x20;
                c_1 = Inst::hi(local_c8);
                b_2 = 0x7a;
                piVar16 = std::min<int>(&c_1,&b_2);
                local_26c = *piVar16 + -0x20;
                for (act_1 = local_260; (int)act_1 <= local_26c; act_1 = act_1 + 1) {
                  uVar10 = (uint)this->bytemap_[(int)act_1];
                  while( true ) {
                    bVar4 = false;
                    if ((int)act_1 < 0xff) {
                      bVar4 = this->bytemap_[(int)(act_1 + 1)] == uVar10;
                    }
                    if (!bVar4) break;
                    act_1 = act_1 + 1;
                  }
                  local_284 = b_1 << 0x10 | ip._4_4_;
                  if ((id_1._3_1_ & 1) != 0) {
                    local_284 = local_284 | 0x40;
                  }
                  if ((pOStack_a8[(long)(int)uVar10 + 1].matchcond &
                      (kEmptyNonWordBoundary|kEmptyWordBoundary)) ==
                      (kEmptyNonWordBoundary|kEmptyWordBoundary)) {
                    pOStack_a8[(long)(int)uVar10 + 1].matchcond = local_284;
                  }
                  else if (pOStack_a8[(long)(int)uVar10 + 1].matchcond != local_284)
                  goto LAB_0018da6a;
                }
              }
              iVar6 = Inst::last(local_c8);
              if (iVar6 != 0) goto LAB_0018d047;
              bVar4 = AddQ((Instq *)local_80,local_b8 + 1);
              if (bVar4) {
                local_b8 = local_b8 + 1;
                goto LAB_0018d088;
              }
              break;
            case kInstCapture:
            case kInstEmptyWidth:
            case kInstNop:
              iVar6 = Inst::last(local_c8);
              if (iVar6 == 0) {
                bVar4 = AddQ((Instq *)local_80,local_b8 + 1);
                if (!bVar4) break;
                piVar13[(long)(int)cond * 2] = local_b8 + 1;
                piVar13[(long)(int)cond * 2 + 1] = ip._4_4_;
                cond = cond + 1;
              }
              IVar9 = Inst::opcode(local_c8);
              if ((IVar9 == kInstCapture) && (iVar6 = Inst::cap(local_c8), iVar6 < 10)) {
                iVar6 = Inst::cap(local_c8);
                ip._4_4_ = 0x20 << ((byte)iVar6 & 0x1f) | ip._4_4_;
              }
              IVar9 = Inst::opcode(local_c8);
              if (IVar9 == kInstEmptyWidth) {
                EVar11 = Inst::empty(local_c8);
                ip._4_4_ = EVar11 | ip._4_4_;
              }
              iVar6 = Inst::out(local_c8);
              bVar4 = AddQ((Instq *)local_80,iVar6);
              if (bVar4) {
                local_b8 = Inst::out(local_c8);
                goto LAB_0018d088;
              }
              break;
            case kInstMatch:
              if ((id_1._3_1_ & 1) != 0) break;
              id_1._3_1_ = 1;
              pOStack_a8->matchcond = ip._4_4_;
              iVar6 = Inst::last(local_c8);
              if (iVar6 != 0) goto LAB_0018d047;
              bVar4 = AddQ((Instq *)local_80,local_b8 + 1);
              if (!bVar4) break;
              local_b8 = local_b8 + 1;
              goto LAB_0018d088;
            case kInstFail:
              goto switchD_0018d0f0_caseD_7;
            default:
              LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&c,
                         "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/onepass.cc"
                         ,0x1b4);
              poVar15 = LogMessage::stream((LogMessage *)&c);
              poVar15 = std::operator<<(poVar15,"unhandled opcode: ");
              IVar9 = Inst::opcode(local_c8);
              std::ostream::operator<<(poVar15,IVar9);
              LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&c);
              goto LAB_0018d047;
            }
LAB_0018da6a:
            if (piVar13 != (int *)0x0) {
              operator_delete__(piVar13);
            }
            if (__s != (void *)0x0) {
              operator_delete__(__s);
            }
            if (nodes_00 != (uint8 *)0x0) {
              operator_delete__(nodes_00);
            }
            this_local._7_1_ = false;
            goto LAB_0018dacf;
          }
        }
        uVar12 = (ulong)((int)it * statesize_00);
        if ((long)uVar12 < 0) {
          uVar12 = 0xffffffffffffffff;
        }
        nodes_01 = (uint8 *)operator_new__(uVar12);
        memmove(nodes_01,nodes_00,(long)((int)it * statesize_00));
        if (nodes_00 != (uint8 *)0x0) {
          operator_delete__(nodes_00);
        }
        iVar5 = start(this);
        pOVar17 = IndexToNode(nodes_01,statesize_00,*(int *)((long)__s + (long)iVar5 * 4));
        this->onepass_start_ = pOVar17;
        this->onepass_nodes_ = nodes_01;
        this->onepass_statesize_ = statesize_00;
        this->dfa_mem_ = this->dfa_mem_ - (long)((int)it * statesize_00);
        if (piVar13 != (int *)0x0) {
          operator_delete__(piVar13);
        }
        if (__s != (void *)0x0) {
          operator_delete__(__s);
        }
        this_local._7_1_ = true;
LAB_0018dacf:
        SparseSet::~SparseSet((SparseSet *)local_80);
        SparseSet::~SparseSet((SparseSet *)&workq.dense_);
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = this->onepass_start_ != (OneState *)0x0;
  }
  return this_local._7_1_;
switchD_0018d0f0_caseD_7:
  goto LAB_0018d047;
}

Assistant:

bool Prog::IsOnePass() {
  if (did_onepass_)
    return onepass_start_ != NULL;
  did_onepass_ = true;

  if (start() == 0)  // no match
    return false;

  // Steal memory for the one-pass NFA from the overall DFA budget.
  // Willing to use at most 1/4 of the DFA budget (heuristic).
  // Limit max node count to 65000 as a conservative estimate to
  // avoid overflowing 16-bit node index in encoding.
  int maxnodes = 2 + inst_count(kInstByteRange);
  int statesize = sizeof(OneState) + bytemap_range_*sizeof(uint32);
  if (maxnodes >= 65000 || dfa_mem_ / 4 / statesize < maxnodes)
    return false;

  // Flood the graph starting at the start state, and check
  // that in each reachable state, each possible byte leads
  // to a unique next state.
  int stacksize = inst_count(kInstCapture) +
                  inst_count(kInstEmptyWidth) +
                  inst_count(kInstNop) + 1;  // + 1 for start inst
  InstCond* stack = new InstCond[stacksize];

  int size = this->size();
  int* nodebyid = new int[size];  // indexed by ip
  memset(nodebyid, 0xFF, size*sizeof nodebyid[0]);

  uint8* nodes = new uint8[maxnodes*statesize];
  uint8* nodep = nodes;

  Instq tovisit(size), workq(size);
  AddQ(&tovisit, start());
  nodebyid[start()] = 0;
  nodep += statesize;
  int nalloc = 1;
  for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
    int id = *it;
    int nodeindex = nodebyid[id];
    OneState* node = IndexToNode(nodes, statesize, nodeindex);

    // Flood graph using manual stack, filling in actions as found.
    // Default is none.
    for (int b = 0; b < bytemap_range_; b++)
      node->action[b] = kImpossible;
    node->matchcond = kImpossible;

    workq.clear();
    bool matched = false;
    int nstack = 0;
    stack[nstack].id = id;
    stack[nstack++].cond = 0;
    while (nstack > 0) {
      int id = stack[--nstack].id;
      uint32 cond = stack[nstack].cond;

    Loop:
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
          break;

        case kInstAltMatch:
          // TODO(rsc): Ignoring kInstAltMatch optimization.
          // Should implement it in this engine, but it's subtle.
          DCHECK(!ip->last());
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstByteRange: {
          int nextindex = nodebyid[ip->out()];
          if (nextindex == -1) {
            if (nalloc >= maxnodes) {
              if (Debug)
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: hit node limit %d > %d", nalloc, maxnodes);
              goto fail;
            }
            nextindex = nalloc;
            nodep += statesize;
            nodebyid[ip->out()] = nextindex;
            nalloc++;
            AddQ(&tovisit, ip->out());
          }
          for (int c = ip->lo(); c <= ip->hi(); c++) {
            int b = bytemap_[c];
            // Skip any bytes immediately after c that are also in b.
            while (c < 256-1 && bytemap_[c+1] == b)
              c++;
            uint32 act = node->action[b];
            uint32 newact = (nextindex << kIndexShift) | cond;
            if (matched)
              newact |= kMatchWins;
            if ((act & kImpossible) == kImpossible) {
              node->action[b] = newact;
            } else if (act != newact) {
              if (Debug) {
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: conflict on byte %#x at state %d", c, *it);
              }
              goto fail;
            }
          }
          if (ip->foldcase()) {
            Rune lo = max<Rune>(ip->lo(), 'a') + 'A' - 'a';
            Rune hi = min<Rune>(ip->hi(), 'z') + 'A' - 'a';
            for (int c = lo; c <= hi; c++) {
              int b = bytemap_[c];
              // Skip any bytes immediately after c that are also in b.
              while (c < 256-1 && bytemap_[c+1] == b)
                c++;
              uint32 act = node->action[b];
              uint32 newact = (nextindex << kIndexShift) | cond;
              if (matched)
                newact |= kMatchWins;
              if ((act & kImpossible) == kImpossible) {
                node->action[b] = newact;
              } else if (act != newact) {
                if (Debug) {
                  LOG(ERROR) << StringPrintf(
                      "Not OnePass: conflict on byte %#x at state %d", c, *it);
                }
                goto fail;
              }
            }
          }

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;
        }

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last()) {
            // If already on work queue, (1) is violated: bail out.
            if (!AddQ(&workq, id+1))
              goto fail;
            stack[nstack].id = id+1;
            stack[nstack++].cond = cond;
          }

          if (ip->opcode() == kInstCapture && ip->cap() < kMaxCap)
            cond |= (1 << kCapShift) << ip->cap();
          if (ip->opcode() == kInstEmptyWidth)
            cond |= ip->empty();

          // kInstCapture and kInstNop always proceed to ip->out().
          // kInstEmptyWidth only sometimes proceeds to ip->out(),
          // but as a conservative approximation we assume it always does.
          // We could be a little more precise by looking at what c
          // is, but that seems like overkill.

          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, ip->out())) {
            if (Debug) {
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple paths %d -> %d\n", *it, ip->out());
            }
            goto fail;
          }
          id = ip->out();
          goto Loop;

        case kInstMatch:
          if (matched) {
            // (3) is violated
            if (Debug) {
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple matches from %d\n", *it);
            }
            goto fail;
          }
          matched = true;
          node->matchcond = cond;

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstFail:
          break;
      }
    }
  }

  if (Debug) {  // For debugging, dump one-pass NFA to LOG(ERROR).
    LOG(ERROR) << "bytemap:\n" << DumpByteMap();
    LOG(ERROR) << "prog:\n" << Dump();

    map<int, int> idmap;
    for (int i = 0; i < size; i++)
      if (nodebyid[i] != -1)
        idmap[nodebyid[i]] = i;

    string dump;
    for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
      int id = *it;
      int nodeindex = nodebyid[id];
      if (nodeindex == -1)
        continue;
      OneState* node = IndexToNode(nodes, statesize, nodeindex);
      StringAppendF(&dump, "node %d id=%d: matchcond=%#x\n",
                    nodeindex, id, node->matchcond);
      for (int i = 0; i < bytemap_range_; i++) {
        if ((node->action[i] & kImpossible) == kImpossible)
          continue;
        StringAppendF(&dump, "  %d cond %#x -> %d id=%d\n",
                      i, node->action[i] & 0xFFFF,
                      node->action[i] >> kIndexShift,
                      idmap[node->action[i] >> kIndexShift]);
      }
    }
    LOG(ERROR) << "nodes:\n" << dump;
  }

  // Overallocated earlier; cut down to actual size.
  nodep = new uint8[nalloc*statesize];
  memmove(nodep, nodes, nalloc*statesize);
  delete[] nodes;
  nodes = nodep;

  onepass_start_ = IndexToNode(nodes, statesize, nodebyid[start()]);
  onepass_nodes_ = nodes;
  onepass_statesize_ = statesize;
  dfa_mem_ -= nalloc*statesize;

  delete[] stack;
  delete[] nodebyid;
  return true;

fail:
  delete[] stack;
  delete[] nodebyid;
  delete[] nodes;
  return false;
}